

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O1

void Io_NtkWriteConvertedBox(FILE *pFile,Abc_Ntk_t *pNtk,int fSeq)

{
  long *plVar1;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  size_t __size;
  char *pcVar6;
  int iVar7;
  
  if (fSeq == 0) {
    fwrite(".attrib white box comb\n",0x17,1,(FILE *)pFile);
    pcVar6 = ".delay 1\n";
    __size = 9;
  }
  else {
    pcVar6 = ".attrib white box seq\n";
    __size = 0x16;
  }
  fwrite(pcVar6,__size,1,(FILE *)pFile);
  pVVar2 = pNtk->vPos;
  if (0 < pVVar2->nSize) {
    pcVar6 = " %s_in\n";
    if (fSeq == 0) {
      pcVar6 = " %s\n";
    }
    lVar5 = 0;
    do {
      plVar1 = (long *)pVVar2->pArray[lVar5];
      fwrite(".names",6,1,(FILE *)pFile);
      Io_NtkWritePis(pFile,pNtk,1);
      pcVar3 = Abc_ObjName(*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8)
                          );
      fprintf((FILE *)pFile,pcVar6,pcVar3);
      if (0 < pNtk->vPis->nSize) {
        iVar7 = 0;
        do {
          fputc(0x31,(FILE *)pFile);
          iVar7 = iVar7 + 1;
        } while (iVar7 < pNtk->vPis->nSize);
      }
      fwrite(" 1\n",3,1,(FILE *)pFile);
      if (fSeq != 0) {
        pcVar3 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                              (long)*(int *)plVar1[4] * 8));
        pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                              (long)*(int *)plVar1[4] * 8));
        fprintf((FILE *)pFile,".latch %s_in %s 1\n",pcVar3,pcVar4);
      }
      lVar5 = lVar5 + 1;
      pVVar2 = pNtk->vPos;
    } while (lVar5 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Io_NtkWriteConvertedBox( FILE * pFile, Abc_Ntk_t * pNtk, int fSeq )
{
    Abc_Obj_t * pObj;
    int i, v;
    if ( fSeq )
    {
        fprintf( pFile, ".attrib white box seq\n" );
    }
    else
    {
        fprintf( pFile, ".attrib white box comb\n" );
        fprintf( pFile, ".delay 1\n" );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    { 
        // write the .names line
        fprintf( pFile, ".names" );
        Io_NtkWritePis( pFile, pNtk, 1 );
        if ( fSeq )
            fprintf( pFile, " %s_in\n", Abc_ObjName(Abc_ObjFanin0(pObj)) );
        else
            fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanin0(pObj)) );
        for ( v = 0; v < Abc_NtkPiNum(pNtk); v++ )
            fprintf( pFile, "1" );
        fprintf( pFile, " 1\n" );
        if ( fSeq )
            fprintf( pFile, ".latch %s_in %s 1\n", Abc_ObjName(Abc_ObjFanin0(pObj)), Abc_ObjName(Abc_ObjFanin0(pObj)) );
    }
}